

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::CommandLineInterface::EnforceEditionsSupport
          (CommandLineInterface *this,string *codegen_name,uint64_t supported_features,
          Edition minimum_edition,Edition maximum_edition,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files)

{
  pointer ppFVar1;
  FileDescriptor *this_00;
  bool bVar2;
  Edition EVar3;
  char *extraout_RDX;
  pointer ppFVar4;
  Arg *this_01;
  string_view filename;
  string_view format;
  string_view format_00;
  string_view format_01;
  undefined4 uStack_170;
  Edition edition;
  string *local_168;
  Edition maximum_edition_local;
  Edition minimum_edition_local;
  uint64_t local_158;
  StringifySink local_150;
  undefined1 local_130 [32];
  string local_110;
  Arg local_f0;
  Arg local_c0;
  size_type local_90;
  pointer local_88;
  Arg local_60;
  
  if (this->experimental_editions_ == false) {
    ppFVar1 = (parsed_files->
              super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    local_168 = codegen_name;
    maximum_edition_local = maximum_edition;
    minimum_edition_local = minimum_edition;
    local_158 = supported_features;
    for (ppFVar4 = (parsed_files->
                   super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_start; ppFVar4 != ppFVar1;
        ppFVar4 = ppFVar4 + 1) {
      this_00 = *ppFVar4;
      EVar3 = FileDescriptor::edition(this_00);
      edition = EVar3;
      if ((999 < (int)EVar3) &&
         (filename._M_str = extraout_RDX,
         filename._M_len = (size_t)(this_00->name_->_M_dataplus)._M_p,
         bVar2 = CanSkipEditionCheck((compiler *)this_00->name_->_M_string_length,filename), !bVar2)
         ) {
        if ((local_158 & 2) == 0) {
          local_88 = (this_00->name_->_M_dataplus)._M_p;
          local_90 = this_00->name_->_M_string_length;
          local_c0.piece_._M_str = (local_168->_M_dataplus)._M_p;
          local_c0.piece_._M_len = local_168->_M_string_length;
          format._M_str = (char *)&local_90;
          format._M_len =
               (size_t)
               "$0: is an editions file, but code generator $1 hasn\'t been updated to support editions yet.  Please ask the owner of this code generator to add support or switch back to proto2/proto3.\n\nSee https://protobuf.dev/editions/overview/ for more information."
          ;
          absl::lts_20250127::Substitute_abi_cxx11_
                    ((string *)&local_f0,(lts_20250127 *)0xfb,format,&local_c0,(Arg *)parsed_files);
          std::operator<<((ostream *)&std::cerr,(string *)&local_f0);
          this_01 = &local_f0;
          goto LAB_0019d6e1;
        }
        if ((int)EVar3 < (int)minimum_edition) {
          local_88 = (this_00->name_->_M_dataplus)._M_p;
          local_90 = this_00->name_->_M_string_length;
          local_c0.piece_._M_str = (local_168->_M_dataplus)._M_p;
          local_c0.piece_._M_len = local_168->_M_string_length;
          local_130._0_8_ = local_130 + 0x10;
          local_130._16_8_ = 0;
          local_130._24_8_ = 0;
          local_130._8_8_ = (char *)0x0;
          local_f0.piece_ =
               absl::lts_20250127::strings_internal::
               ExtractStringification<google::protobuf::Edition>
                         ((StringifySink *)local_130,&edition);
          local_150.buffer_._M_dataplus._M_p = (pointer)&local_150.buffer_.field_2;
          local_150.buffer_.field_2._M_allocated_capacity = 0;
          local_150.buffer_.field_2._8_8_ = 0;
          local_150.buffer_._M_string_length = 0;
          local_60.piece_ =
               absl::lts_20250127::strings_internal::
               ExtractStringification<google::protobuf::Edition>(&local_150,&minimum_edition_local);
          format_00._M_str = (char *)&local_90;
          format_00._M_len =
               (size_t)
               "$0: is a file using edition $2, which isn\'t supported by code generator $1.  Please upgrade your file to at least edition $3."
          ;
          absl::lts_20250127::Substitute_abi_cxx11_
                    (&local_110,(lts_20250127 *)0x7d,format_00,&local_c0,&local_f0,&local_60,
                     (Arg *)CONCAT44(edition,uStack_170));
          std::operator<<((ostream *)&std::cerr,(string *)&local_110);
        }
        else {
          if ((int)EVar3 <= (int)maximum_edition) goto LAB_0019d48d;
          local_88 = (this_00->name_->_M_dataplus)._M_p;
          local_90 = this_00->name_->_M_string_length;
          local_c0.piece_._M_str = (local_168->_M_dataplus)._M_p;
          local_c0.piece_._M_len = local_168->_M_string_length;
          local_130._0_8_ = local_130 + 0x10;
          local_130._16_8_ = 0;
          local_130._24_8_ = 0;
          local_130._8_8_ = (char *)0x0;
          local_f0.piece_ =
               absl::lts_20250127::strings_internal::
               ExtractStringification<google::protobuf::Edition>
                         ((StringifySink *)local_130,&edition);
          local_150.buffer_._M_dataplus._M_p = (pointer)&local_150.buffer_.field_2;
          local_150.buffer_.field_2._M_allocated_capacity = 0;
          local_150.buffer_.field_2._8_8_ = 0;
          local_150.buffer_._M_string_length = 0;
          local_60.piece_ =
               absl::lts_20250127::strings_internal::
               ExtractStringification<google::protobuf::Edition>(&local_150,&maximum_edition_local);
          format_01._M_str = (char *)&local_90;
          format_01._M_len =
               (size_t)
               "$0: is a file using edition $2, which isn\'t supported by code generator $1.  Please ask the owner of this code generator to add support or switch back to a maximum of edition $3."
          ;
          absl::lts_20250127::Substitute_abi_cxx11_
                    (&local_110,(lts_20250127 *)0xb2,format_01,&local_c0,&local_f0,&local_60,
                     (Arg *)CONCAT44(edition,uStack_170));
          std::operator<<((ostream *)&std::cerr,(string *)&local_110);
        }
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_150);
        this_01 = (Arg *)local_130;
LAB_0019d6e1:
        std::__cxx11::string::~string((string *)this_01);
        return false;
      }
LAB_0019d48d:
    }
  }
  return true;
}

Assistant:

bool CommandLineInterface::EnforceEditionsSupport(
    const std::string& codegen_name, uint64_t supported_features,
    Edition minimum_edition, Edition maximum_edition,
    const std::vector<const FileDescriptor*>& parsed_files) const {
  if (experimental_editions_) {
    // The user has explicitly specified the experimental flag.
    return true;
  }
  for (const auto* fd : parsed_files) {
    Edition edition =
        ::google::protobuf::internal::InternalFeatureHelper::GetEdition(*fd);
    if (edition < Edition::EDITION_2023 || CanSkipEditionCheck(fd->name())) {
      // Legacy proto2/proto3 or exempted files don't need any checks.
      continue;
    }

    if ((supported_features & CodeGenerator::FEATURE_SUPPORTS_EDITIONS) == 0) {
      std::cerr << absl::Substitute(
          "$0: is an editions file, but code generator $1 hasn't been "
          "updated to support editions yet.  Please ask the owner of this code "
          "generator to add support or switch back to proto2/proto3.\n\nSee "
          "https://protobuf.dev/editions/overview/ for more information.",
          fd->name(), codegen_name);
      return false;
    }
    if (edition < minimum_edition) {
      std::cerr << absl::Substitute(
          "$0: is a file using edition $2, which isn't supported by code "
          "generator $1.  Please upgrade your file to at least edition $3.",
          fd->name(), codegen_name, edition, minimum_edition);
      return false;
    }
    if (edition > maximum_edition) {
      std::cerr << absl::Substitute(
          "$0: is a file using edition $2, which isn't supported by code "
          "generator $1.  Please ask the owner of this code generator to add "
          "support or switch back to a maximum of edition $3.",
          fd->name(), codegen_name, edition, maximum_edition);
      return false;
    }
  }
  return true;
}